

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxlib.c
# Opt level: O3

char * deblank(char *input)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  if (input == (char *)0x0) {
    return (char *)0x0;
  }
  sVar2 = strlen(input);
  if (sVar2 == 0) {
    pcVar4 = (char *)calloc(1,8);
    return pcVar4;
  }
  pcVar4 = input + -1;
  lVar5 = -3;
  lVar6 = -2;
  do {
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + 1;
    pcVar3 = pcVar4 + 1;
    pcVar4 = pcVar4 + 1;
  } while (*pcVar3 == ' ');
  uVar8 = sVar2 & 0xffffffff;
  uVar1 = (int)sVar2 - 1;
  do {
    uVar8 = uVar8 - 1;
    uVar7 = (uint)uVar8;
    uVar9 = (int)uVar1 >> 0x1f & uVar1;
    if ((int)uVar7 < 1) break;
    uVar9 = uVar7;
  } while (input[uVar7 & 0x7fffffff] == ' ');
  pcVar3 = (char *)calloc((int)uVar9 - lVar5,1);
  pcVar4 = strncpy(pcVar3,pcVar4,(int)uVar9 - lVar6);
  return pcVar4;
}

Assistant:

char* 
deblank(const char* input) 
{
	int start = 0;
	int stop = 0;
	size_t length = 0;
	size_t full_length = 0;
	char* result = (char*)NULL;
	
	if (!input) return NULL;
	
	full_length = strlen(input);
	if (0 == full_length) {
		return (char*)calloc(1, sizeof(char*));
	}
	
	for (start = 0; *(input + start) == ' '; start++)
		;
	
	for (stop = full_length - 1; stop > 0; stop--) {
		if (*(input + stop) != ' ') break;
	} 
	
	length = full_length - start + 1; 
	length -= full_length - stop;
	
	result = (char*)calloc(length + 1, sizeof(char));
	strncpy(result, input + start, length);
	
	/* Normal function termination */
	return result;
}